

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

size_t __thiscall
c4::basic_substring<const_char>::first_not_of
          (basic_substring<const_char> *this,ro_substr chars,size_t start)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  error_flags eVar4;
  size_t sVar5;
  size_t sVar6;
  
  uVar1 = this->len;
  if (uVar1 < start) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
      pcVar2 = (code *)swi(3);
      sVar5 = (*pcVar2)();
      return sVar5;
    }
    handle_error(0x1f8007,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x1756,"(start >= 0 && start <= len) || (start == len && len == 0)");
  }
  sVar5 = 0xffffffffffffffff;
  if (start < uVar1) {
    sVar6 = start;
    while (sVar5 = start, chars.len != 0) {
      sVar5 = 0;
      while (this->str[sVar6] != chars.str[sVar5]) {
        sVar5 = sVar5 + 1;
        if (chars.len == sVar5) {
          return sVar6;
        }
      }
      sVar6 = sVar6 + 1;
      if (sVar6 == uVar1) {
        return 0xffffffffffffffff;
      }
    }
  }
  return sVar5;
}

Assistant:

size_t first_not_of(ro_substr chars, size_t start=0) const
    {
        C4_ASSERT((start >= 0 && start <= len) || (start == len && len == 0));
        for(size_t i = start; i < len; ++i)
        {
            bool gotit = true;
            for(size_t j = 0; j < chars.len; ++j)
            {
                if(str[i] == chars.str[j])
                {
                    gotit = false;
                    break;
                }
            }
            if(gotit)
            {
                return i;
            }
        }
        return npos;
    }